

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

char * extract_symbol_name(char *filter)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  char *in_RDI;
  char *symbol;
  char *temp;
  char *copy;
  char *local_8;
  
  __s = strdup(in_RDI);
  pcVar2 = strtok(__s,":");
  iVar1 = strcmp(pcVar2,"dll");
  if (iVar1 == 0) {
    strtok((char *)0x0,":");
    pcVar2 = strtok((char *)0x0,":");
    if (pcVar2 == (char *)0x0) {
      free(__s);
      local_8 = (char *)0x0;
    }
    else {
      local_8 = strdup(pcVar2);
      free(__s);
    }
  }
  else {
    free(__s);
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static char *
extract_symbol_name(char *filter)
{

    char *copy = strdup(filter);
    char *temp;
    char *symbol;

    temp = strtok(copy, ":");
    if (strcmp(temp, "dll")) {
	free(copy);
	return NULL;
    }
    temp = strtok(NULL, ":");
    temp = strtok(NULL, ":");

    if (temp == NULL) {
	free(copy);
	return NULL;
    }

    symbol = strdup(temp);
    free(copy);

    return symbol;
}